

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O0

Atom_p __thiscall indigox::Bond::GetTargetAtom(Bond *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  weak_ptr<indigox::Atom> *in_RSI;
  element_type *in_RDI;
  shared_ptr<indigox::Atom> sVar3;
  Atom_p AVar4;
  element_type *this_00;
  
  this_00 = in_RDI;
  std::array<std::weak_ptr<indigox::Atom>,_2UL>::operator[]
            ((array<std::weak_ptr<indigox::Atom>,_2UL> *)in_RDI,(size_type)in_RDI);
  bVar1 = std::__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::expired
                    ((__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *)0x10e28a);
  if (bVar1) {
    std::shared_ptr<indigox::Atom>::shared_ptr((shared_ptr<indigox::Atom> *)0x10e2b8);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::array<std::weak_ptr<indigox::Atom>,_2UL>::operator[]
              ((array<std::weak_ptr<indigox::Atom>,_2UL> *)this_00,(size_type)in_RDI);
    sVar3 = std::weak_ptr<indigox::Atom>::lock(in_RSI);
    _Var2 = sVar3.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  AVar4.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  AVar4.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (Atom_p)AVar4.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p Bond::GetTargetAtom() const {
    if (!atoms_[1].expired()) return atoms_[1].lock();
    else return Atom_p();
  }